

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

void __thiscall icu_63::TimeZoneFormat::checkAbuttingHoursAndMinutes(TimeZoneFormat *this)

{
  UVector *this_00;
  void *pvVar1;
  int index;
  int32_t type;
  long lVar2;
  bool bVar3;
  
  this->fAbuttingOffsetHoursAndMinutes = '\0';
  lVar2 = 0;
  do {
    if (lVar2 == 6) {
      return;
    }
    this_00 = this->fGMTOffsetPatternItems[lVar2];
    bVar3 = false;
    for (index = 0; index < this_00->count; index = index + 1) {
      pvVar1 = UVector::elementAt(this_00,index);
      if (*(int *)((long)pvVar1 + 0x10) == 0) {
        if (bVar3) break;
        bVar3 = false;
      }
      else {
        if (bVar3) {
          this->fAbuttingOffsetHoursAndMinutes = '\x01';
          return;
        }
        bVar3 = *(int *)((long)pvVar1 + 0x10) == 1;
      }
    }
    lVar2 = lVar2 + 1;
    if (this->fAbuttingOffsetHoursAndMinutes != '\0') {
      return;
    }
  } while( true );
}

Assistant:

void
TimeZoneFormat::checkAbuttingHoursAndMinutes() {
    fAbuttingOffsetHoursAndMinutes= FALSE;
    for (int32_t type = 0; type < UTZFMT_PAT_COUNT; type++) {
        UBool afterH = FALSE;
        UVector *items = fGMTOffsetPatternItems[type];
        for (int32_t i = 0; i < items->size(); i++) {
            const GMTOffsetField* item = (GMTOffsetField*)items->elementAt(i);
            GMTOffsetField::FieldType fieldType = item->getType();
            if (fieldType != GMTOffsetField::TEXT) {
                if (afterH) {
                    fAbuttingOffsetHoursAndMinutes = TRUE;
                    break;
                } else if (fieldType == GMTOffsetField::HOUR) {
                    afterH = TRUE;
                }
            } else if (afterH) {
                break;
            }
        }
        if (fAbuttingOffsetHoursAndMinutes) {
            break;
        }
    }
}